

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

LY_ERR lyxml_ctx_next(lyxml_ctx *xmlctx)

{
  lyd_node *plVar1;
  lyxml_elem *e;
  ly_bool closing;
  lyxml_ctx *plStack_10;
  LY_ERR ret;
  lyxml_ctx *xmlctx_local;
  
  e._4_4_ = LY_SUCCESS;
  plStack_10 = xmlctx;
  if (((xmlctx->status == LYXML_ELEM_CONTENT) || (xmlctx->status == LYXML_ATTR_CONTENT)) &&
     ((xmlctx->field_6).dynamic != '\0')) {
    free((xmlctx->field_3).prefix);
    (plStack_10->field_3).prefix = (char *)0x0;
    (plStack_10->field_6).dynamic = '\0';
  }
  switch(plStack_10->status) {
  case LYXML_ELEMENT:
  case LYXML_ATTR_CONTENT:
    e._4_4_ = lyxml_next_attribute
                        (plStack_10,&(plStack_10->field_3).prefix,&(plStack_10->field_4).prefix_len,
                         &(plStack_10->field_5).name,&(plStack_10->field_6).name_len);
    if (e._4_4_ == LY_SUCCESS) {
      if (*plStack_10->in->current == '>') {
        ly_in_skip(plStack_10->in,1);
        if (*plStack_10->in->current == '\0') {
          ly_vlog(plStack_10->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
          e._4_4_ = LY_EVALID;
        }
        else {
          e._4_4_ = lyxml_parse_value(plStack_10,'<',&(plStack_10->field_3).prefix,
                                      &(plStack_10->field_4).prefix_len,
                                      &(plStack_10->field_5).ws_only,&(plStack_10->field_6).dynamic)
          ;
          if (e._4_4_ == LY_SUCCESS) {
            if ((plStack_10->field_4).prefix_len == 0) {
              if ((plStack_10->field_6).dynamic != '\0') {
                free((plStack_10->field_3).prefix);
              }
              (plStack_10->field_3).prefix = "";
              (plStack_10->field_6).dynamic = '\0';
            }
            plStack_10->status = LYXML_ELEM_CONTENT;
          }
        }
      }
      else if (*plStack_10->in->current == '/') {
        (plStack_10->field_3).prefix = "";
        (plStack_10->field_4).prefix_len = 0;
        (plStack_10->field_5).ws_only = '\x01';
        (plStack_10->field_6).dynamic = '\0';
        plStack_10->status = LYXML_ELEM_CONTENT;
      }
      else {
        plStack_10->status = LYXML_ATTRIBUTE;
      }
    }
    break;
  case LYXML_ELEM_CONTENT:
    if (*plStack_10->in->current == '/') {
      if ((plStack_10->elements).count == 0) {
        __assert_fail("xmlctx->elements.count",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xml.c"
                      ,0x3cf,"LY_ERR lyxml_ctx_next(struct lyxml_ctx *)");
      }
      plVar1 = (plStack_10->elements).field_2.dnodes[(plStack_10->elements).count - 1];
      e._4_4_ = lyxml_close_element(plStack_10,*(char **)plVar1,(size_t)plVar1->parent,
                                    (char *)plVar1->schema,(size_t)plVar1->next,'\x01');
      if (e._4_4_ == LY_SUCCESS) {
        plStack_10->status = LYXML_ELEM_CLOSE;
      }
      break;
    }
  case LYXML_ELEM_CLOSE:
    e._4_4_ = lyxml_next_element(plStack_10,&(plStack_10->field_3).prefix,
                                 &(plStack_10->field_4).prefix_len,&(plStack_10->field_5).name,
                                 &(plStack_10->field_6).name_len,(ly_bool *)((long)&e + 3));
    if (e._4_4_ == LY_SUCCESS) {
      if (*plStack_10->in->current == '\0') {
        plStack_10->status = LYXML_END;
      }
      else if (e._3_1_ == '\0') {
        e._4_4_ = lyxml_open_element(plStack_10,(plStack_10->field_3).prefix,
                                     (plStack_10->field_4).prefix_len,(plStack_10->field_5).name,
                                     (plStack_10->field_6).name_len);
        if (e._4_4_ == LY_SUCCESS) {
          plStack_10->status = LYXML_ELEMENT;
        }
      }
      else {
        e._4_4_ = lyxml_close_element(plStack_10,(plStack_10->field_3).prefix,
                                      (plStack_10->field_4).prefix_len,(plStack_10->field_5).name,
                                      (plStack_10->field_6).name_len,'\0');
        if (e._4_4_ == LY_SUCCESS) {
          plStack_10->status = LYXML_ELEM_CLOSE;
        }
      }
    }
    break;
  case LYXML_ATTRIBUTE:
    e._4_4_ = lyxml_next_attr_content
                        (plStack_10,&(plStack_10->field_3).prefix,&(plStack_10->field_4).prefix_len,
                         &(plStack_10->field_5).ws_only,&(plStack_10->field_6).dynamic);
    if (e._4_4_ == LY_SUCCESS) {
      plStack_10->status = LYXML_ATTR_CONTENT;
    }
    break;
  case LYXML_END:
  }
  if (e._4_4_ != LY_SUCCESS) {
    plStack_10->status = LYXML_END;
  }
  return e._4_4_;
}

Assistant:

LY_ERR
lyxml_ctx_next(struct lyxml_ctx *xmlctx)
{
    LY_ERR ret = LY_SUCCESS;
    ly_bool closing;
    struct lyxml_elem *e;

    /* if the value was not used, free it */
    if (((xmlctx->status == LYXML_ELEM_CONTENT) || (xmlctx->status == LYXML_ATTR_CONTENT)) && xmlctx->dynamic) {
        free((char *)xmlctx->value);
        xmlctx->value = NULL;
        xmlctx->dynamic = 0;
    }

    switch (xmlctx->status) {
    case LYXML_ELEM_CONTENT:
        /* content |</elem> */

        /* handle special case when empty content for "<elem/>" was returned */
        if (xmlctx->in->current[0] == '/') {
            assert(xmlctx->elements.count);
            e = (struct lyxml_elem *)xmlctx->elements.objs[xmlctx->elements.count - 1];

            /* close the element (parses closing tag) */
            ret = lyxml_close_element(xmlctx, e->prefix, e->prefix_len, e->name, e->name_len, 1);
            LY_CHECK_GOTO(ret, cleanup);

            /* update status */
            xmlctx->status = LYXML_ELEM_CLOSE;
            break;
        }
    /* fall through */
    case LYXML_ELEM_CLOSE:
        /* </elem>| <elem2>* */

        /* parse next element, if any */
        ret = lyxml_next_element(xmlctx, &xmlctx->prefix, &xmlctx->prefix_len, &xmlctx->name, &xmlctx->name_len, &closing);
        LY_CHECK_GOTO(ret, cleanup);

        if (xmlctx->in->current[0] == '\0') {
            /* update status */
            xmlctx->status = LYXML_END;
        } else if (closing) {
            /* close an element (parses also closing tag) */
            ret = lyxml_close_element(xmlctx, xmlctx->prefix, xmlctx->prefix_len, xmlctx->name, xmlctx->name_len, 0);
            LY_CHECK_GOTO(ret, cleanup);

            /* update status */
            xmlctx->status = LYXML_ELEM_CLOSE;
        } else {
            /* open an element, also parses all enclosed namespaces */
            ret = lyxml_open_element(xmlctx, xmlctx->prefix, xmlctx->prefix_len, xmlctx->name, xmlctx->name_len);
            LY_CHECK_GOTO(ret, cleanup);

            /* update status */
            xmlctx->status = LYXML_ELEMENT;
        }
        break;

    case LYXML_ELEMENT:
    /* <elem| attr='val'* > content  */
    case LYXML_ATTR_CONTENT:
        /* attr='val'| attr='val'* > content */

        /* parse attribute name, if any */
        ret = lyxml_next_attribute(xmlctx, &xmlctx->prefix, &xmlctx->prefix_len, &xmlctx->name, &xmlctx->name_len);
        LY_CHECK_GOTO(ret, cleanup);

        if (xmlctx->in->current[0] == '>') {
            /* no attributes but a closing tag */
            ly_in_skip(xmlctx->in, 1);
            if (!xmlctx->in->current[0]) {
                LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
                ret = LY_EVALID;
                goto cleanup;
            }

            /* parse element content */
            ret = lyxml_parse_value(xmlctx, '<', (char **)&xmlctx->value, &xmlctx->value_len, &xmlctx->ws_only,
                    &xmlctx->dynamic);
            LY_CHECK_GOTO(ret, cleanup);

            if (!xmlctx->value_len) {
                /* empty value should by alocated staticaly, but check for in any case */
                if (xmlctx->dynamic) {
                    free((char *) xmlctx->value);
                }
                /* use empty value, easier to work with */
                xmlctx->value = "";
                xmlctx->dynamic = 0;
            }

            /* update status */
            xmlctx->status = LYXML_ELEM_CONTENT;
        } else if (xmlctx->in->current[0] == '/') {
            /* no content but we still return it */
            xmlctx->value = "";
            xmlctx->value_len = 0;
            xmlctx->ws_only = 1;
            xmlctx->dynamic = 0;

            /* update status */
            xmlctx->status = LYXML_ELEM_CONTENT;
        } else {
            /* update status */
            xmlctx->status = LYXML_ATTRIBUTE;
        }
        break;

    case LYXML_ATTRIBUTE:
        /* attr|='val' */

        /* skip formatting and parse value */
        ret = lyxml_next_attr_content(xmlctx, &xmlctx->value, &xmlctx->value_len, &xmlctx->ws_only, &xmlctx->dynamic);
        LY_CHECK_GOTO(ret, cleanup);

        /* update status */
        xmlctx->status = LYXML_ATTR_CONTENT;
        break;

    case LYXML_END:
        /* </elem>   |EOF */
        /* nothing to do */
        break;
    }

cleanup:
    if (ret) {
        /* invalidate context */
        xmlctx->status = LYXML_END;
    }
    return ret;
}